

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 neon_load_reg(TCGContext_conflict1 *tcg_ctx,int reg,int pass)

{
  TCGv_ptr arg2;
  TCGv_i32 ret;
  long offset;
  TCGv_i32 tmp;
  int pass_local;
  int reg_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  arg2 = tcg_ctx->cpu_env;
  offset = neon_reg_offset(reg,pass);
  tcg_gen_ld_i32(tcg_ctx,ret,arg2,offset);
  return ret;
}

Assistant:

static TCGv_i32 neon_load_reg(TCGContext *tcg_ctx, int reg, int pass)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ld_i32(tcg_ctx, tmp, tcg_ctx->cpu_env, neon_reg_offset(reg, pass));
    return tmp;
}